

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_writer.h
# Opt level: O3

string * __thiscall
cppwinrt::writer_base<cppwinrt::writer>::write_temp<>
          (string *__return_storage_ptr__,writer_base<cppwinrt::writer> *this,string_view *value)

{
  char cVar1;
  pointer pcVar2;
  pointer pcVar3;
  size_t sVar4;
  int iVar5;
  bool bVar6;
  size_type __new_size;
  
  __new_size = (long)(this->m_first).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->m_first).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start;
  if (value->_M_len != 0) {
    sVar4 = 0;
    iVar5 = 0;
    bVar6 = false;
    do {
      if (bVar6) {
LAB_00174028:
        bVar6 = false;
      }
      else {
        cVar1 = value->_M_str[sVar4];
        if (cVar1 == '%') {
LAB_00174026:
          iVar5 = iVar5 + 1;
          goto LAB_00174028;
        }
        if (cVar1 != '^') {
          if (cVar1 != '@') goto LAB_00174028;
          goto LAB_00174026;
        }
        bVar6 = true;
      }
      sVar4 = sVar4 + 1;
    } while (value->_M_len != sVar4);
    if (iVar5 != 0) {
      __assert_fail("count_placeholders(value) == sizeof...(Args)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/oldnewthing[P]cppwinrt/cppwinrt/text_writer.h"
                    ,0x32,
                    "std::string cppwinrt::writer_base<cppwinrt::writer>::write_temp(const std::string_view &, const Args &...) [T = cppwinrt::writer, Args = <>]"
                   );
    }
  }
  write_segment(this,value);
  pcVar2 = (this->m_first).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar3 = (this->m_first).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pcVar2 + __new_size,pcVar3);
  std::vector<char,_std::allocator<char>_>::resize(&this->m_first,__new_size);
  return __return_storage_ptr__;
}

Assistant:

std::string write_temp(std::string_view const& value, Args const&... args)
        {
#if defined(_DEBUG)
            bool restore_debug_trace = debug_trace;
            debug_trace = false;
#endif
            auto const size = m_first.size();

            assert(count_placeholders(value) == sizeof...(Args));
            write_segment(value, args...);

            std::string result{ m_first.data() + size, m_first.size() - size };
            m_first.resize(size);

#if defined(_DEBUG)
            debug_trace = restore_debug_trace;
#endif
            return result;
        }